

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_checkScalingFactorBothNonBaseUnitsImported_Test::
~Units_checkScalingFactorBothNonBaseUnitsImported_Test
          (Units_checkScalingFactorBothNonBaseUnitsImported_Test *this)

{
  Units_checkScalingFactorBothNonBaseUnitsImported_Test *this_local;
  
  ~Units_checkScalingFactorBothNonBaseUnitsImported_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, checkScalingFactorBothNonBaseUnitsImported)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");
    u->addUnit("apples", 0, 1.0, 1.0);

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::AMPERE, 0, 1.0, 1.0);
    u1->addUnit("u", 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);
    u2->addUnit("u", 0, 1.0, 1.0);

    model->addUnits(u);
    model->addUnits(u1);
    model->addUnits(u2);

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");

    u->setImportSource(import);

    EXPECT_TRUE(u->isImport());
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}